

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostkey.c
# Opt level: O2

int hostkey_method_ssh_ecdsa_signv
              (LIBSSH2_SESSION *session,uchar **signature,size_t *signature_len,int veccount,
              iovec *datavec,void **abstract)

{
  EVP_PKEY *ec_ctx;
  libssh2_curve_type lVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  size_t sStack_a0;
  EVP_MD_CTX *ctx;
  uchar **local_90;
  size_t *local_88;
  LIBSSH2_SESSION *local_80;
  uchar hash [32];
  
  ec_ctx = (EVP_PKEY *)*abstract;
  lVar1 = _libssh2_ecdsa_get_curve_type(ec_ctx);
  local_90 = signature;
  local_88 = signature_len;
  local_80 = session;
  if (lVar1 == LIBSSH2_EC_CURVE_NISTP521) {
    iVar2 = _libssh2_sha512_init(&ctx);
    if (iVar2 != 0) {
      uVar4 = (ulong)(uint)veccount;
      if (veccount < 1) {
        uVar4 = 0;
      }
      uVar3 = 0;
      do {
        if (uVar4 * 0x10 + 0x10 == uVar3 + 0x10) {
          iVar2 = _libssh2_sha512_final(&ctx,hash);
          if (iVar2 == 0) {
            return -1;
          }
          sStack_a0 = 0x40;
          goto LAB_0011236b;
        }
        iVar2 = _libssh2_sha512_update
                          (&ctx,*(void **)((long)&datavec->iov_base + uVar3),
                           *(size_t *)((long)&datavec->iov_len + uVar3));
        uVar3 = uVar3 + 0x10;
      } while (iVar2 != 0);
    }
  }
  else if (lVar1 == LIBSSH2_EC_CURVE_NISTP384) {
    iVar2 = _libssh2_sha384_init(&ctx);
    if (iVar2 != 0) {
      uVar4 = (ulong)(uint)veccount;
      if (veccount < 1) {
        uVar4 = 0;
      }
      uVar3 = 0;
      do {
        if (uVar4 * 0x10 + 0x10 == uVar3 + 0x10) {
          iVar2 = _libssh2_sha384_final(&ctx,hash);
          if (iVar2 == 0) {
            return -1;
          }
          sStack_a0 = 0x30;
          goto LAB_0011236b;
        }
        iVar2 = _libssh2_sha384_update
                          (&ctx,*(void **)((long)&datavec->iov_base + uVar3),
                           *(size_t *)((long)&datavec->iov_len + uVar3));
        uVar3 = uVar3 + 0x10;
      } while (iVar2 != 0);
    }
  }
  else if ((lVar1 == LIBSSH2_EC_CURVE_NISTP256) && (iVar2 = _libssh2_sha256_init(&ctx), iVar2 != 0))
  {
    uVar4 = (ulong)(uint)veccount;
    if (veccount < 1) {
      uVar4 = 0;
    }
    uVar3 = 0;
    do {
      if (uVar4 * 0x10 + 0x10 == uVar3 + 0x10) {
        iVar2 = _libssh2_sha256_final(&ctx,hash);
        if (iVar2 == 0) {
          return -1;
        }
        sStack_a0 = 0x20;
LAB_0011236b:
        iVar2 = _libssh2_ecdsa_sign(local_80,ec_ctx,hash,sStack_a0,local_90,local_88);
        return iVar2;
      }
      iVar2 = _libssh2_sha256_update
                        (&ctx,*(void **)((long)&datavec->iov_base + uVar3),
                         *(size_t *)((long)&datavec->iov_len + uVar3));
      uVar3 = uVar3 + 0x10;
    } while (iVar2 != 0);
  }
  return -1;
}

Assistant:

static int
hostkey_method_ssh_ecdsa_signv(LIBSSH2_SESSION * session,
                               unsigned char **signature,
                               size_t *signature_len,
                               int veccount,
                               const struct iovec datavec[],
                               void **abstract)
{
    libssh2_ecdsa_ctx *ec_ctx = (libssh2_ecdsa_ctx *) (*abstract);
    libssh2_curve_type type = _libssh2_ecdsa_get_curve_type(ec_ctx);
    int ret = 0;

    if(type == LIBSSH2_EC_CURVE_NISTP256) {
        LIBSSH2_HOSTKEY_METHOD_EC_SIGNV_HASH(256);
    }
    else if(type == LIBSSH2_EC_CURVE_NISTP384) {
        LIBSSH2_HOSTKEY_METHOD_EC_SIGNV_HASH(384);
    }
    else if(type == LIBSSH2_EC_CURVE_NISTP521) {
        LIBSSH2_HOSTKEY_METHOD_EC_SIGNV_HASH(512);
    }
    else {
        return -1;
    }

    return ret;
}